

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

void Ses_ManCleanLight(Ses_Man_t *pSes)

{
  int local_18;
  int local_14;
  int i;
  int h;
  Ses_Man_t *pSes_local;
  
  for (local_14 = 0; local_14 < pSes->nSpecFunc; local_14 = local_14 + 1) {
    if ((pSes->bSpecInv >> ((byte)local_14 & 0x1f) & 1U) != 0) {
      for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
        pSes->pSpec[local_14 * 4 + local_18] =
             pSes->pSpec[local_14 * 4 + local_18] ^ 0xffffffffffffffff;
      }
    }
  }
  if (pSes->pArrTimeProfile != (int *)0x0) {
    for (local_18 = 0; local_18 < pSes->nSpecVars; local_18 = local_18 + 1) {
      pSes->pArrTimeProfile[local_18] = pSes->nArrTimeDelta + pSes->pArrTimeProfile[local_18];
    }
  }
  Vec_IntFree(pSes->vPolar);
  Vec_IntFree(pSes->vAssump);
  Vec_IntFree(pSes->vStairDecVars);
  if (pSes != (Ses_Man_t *)0x0) {
    free(pSes);
  }
  return;
}

Assistant:

static inline void Ses_ManCleanLight( Ses_Man_t * pSes )
{
    int h, i;
    for ( h = 0; h < pSes->nSpecFunc; ++h )
        if ( ( pSes->bSpecInv >> h ) & 1 )
            for ( i = 0; i < 4; ++i )
                pSes->pSpec[(h << 2) + i] = ~( pSes->pSpec[(h << 2) + i] );

    if ( pSes->pArrTimeProfile )
        for ( i = 0; i < pSes->nSpecVars; ++i )
            pSes->pArrTimeProfile[i] += pSes->nArrTimeDelta;

    Vec_IntFree( pSes->vPolar );
    Vec_IntFree( pSes->vAssump );
    Vec_IntFree( pSes->vStairDecVars );

    ABC_FREE( pSes );
}